

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QPen>::emplace<QPen_const&>
          (QMovableArrayOps<QPen> *this,qsizetype i,QPen *args)

{
  QPen **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_58;
  QPen tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QPen>).super_QArrayDataPointer<QPen>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QPen>).super_QArrayDataPointer<QPen>.size == i) {
      qVar5 = QArrayDataPointer<QPen>::freeSpaceAtEnd((QArrayDataPointer<QPen> *)this);
      if (qVar5 == 0) goto LAB_00289116;
      QPen::QPen((this->super_QGenericArrayOps<QPen>).super_QArrayDataPointer<QPen>.ptr +
                 (this->super_QGenericArrayOps<QPen>).super_QArrayDataPointer<QPen>.size,args);
LAB_00289203:
      pqVar2 = &(this->super_QGenericArrayOps<QPen>).super_QArrayDataPointer<QPen>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_002891c2;
    }
LAB_00289116:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QPen>::freeSpaceAtBegin((QArrayDataPointer<QPen> *)this);
      if (qVar5 != 0) {
        QPen::QPen((this->super_QGenericArrayOps<QPen>).super_QArrayDataPointer<QPen>.ptr + -1,args)
        ;
        ppQVar1 = &(this->super_QGenericArrayOps<QPen>).super_QArrayDataPointer<QPen>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_00289203;
      }
    }
  }
  tmp.d.d.ptr = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
  QPen::QPen(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QPen>).super_QArrayDataPointer<QPen>.size != 0;
  QArrayDataPointer<QPen>::detachAndGrow
            ((QArrayDataPointer<QPen> *)this,(uint)(i == 0 && bVar6),1,(QPen **)0x0,
             (QArrayDataPointer<QPen> *)0x0);
  if (i == 0 && bVar6) {
    (this->super_QGenericArrayOps<QPen>).super_QArrayDataPointer<QPen>.ptr[-1].d.d.ptr =
         (QPenPrivate *)tmp.d.d.ptr;
    ppQVar1 = &(this->super_QGenericArrayOps<QPen>).super_QArrayDataPointer<QPen>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QPen>).super_QArrayDataPointer<QPen>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_58,(QArrayDataPointer<QPen> *)this,i,1);
    ((local_58.displaceFrom)->d).d.ptr = (QPenPrivate *)tmp.d.d.ptr;
    local_58.displaceFrom = local_58.displaceFrom + 1;
    (local_58.data)->size = (local_58.data)->size + local_58.nInserts;
  }
  tmp.d.d.ptr = (DataPtr)(totally_ordered_wrapper<QPenPrivate_*>)0x0;
  QPen::~QPen(&tmp);
LAB_002891c2:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }